

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O2

bool DerBase::DecodeSetOrSequenceOf<AlgorithmIdentifier>
               (DerType type,uchar *pIn,size_t cbIn,size_t *cbPrefix,size_t *cbSize,
               vector<AlgorithmIdentifier,_std::allocator<AlgorithmIdentifier>_> *out)

{
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  overflow_error *this;
  size_t sVar5;
  bool bVar6;
  undefined1 local_e0 [8];
  AlgorithmIdentifier t;
  size_t local_50;
  size_t cbElement;
  size_t *local_40;
  bool local_31 [8];
  bool isNull;
  
  local_31[0] = false;
  std::vector<AlgorithmIdentifier,_std::allocator<AlgorithmIdentifier>_>::clear(out);
  t.parameters.encodedValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pIn;
  cbElement = (size_t)cbSize;
  local_40 = cbPrefix;
  bVar2 = DecodeSequenceOrSet(type,pIn,cbIn,cbPrefix,cbSize,local_31);
  if (bVar2) {
    if (local_31[0] == false) {
      sVar5 = *local_40;
      uVar4 = *(long *)cbElement + sVar5;
      do {
        local_50 = 0;
        t.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        local_e0 = (undefined1  [8])&PTR_EncodedSize_001453c8;
        t.algorithm.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.super_DerBase.cbData = (size_t)&PTR_EncodedSize_00146918;
        t.algorithm.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.algorithm.super_DerBase.cbData = 0;
        t.algorithm.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.parameters.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.algorithm.oidIndex = (size_t)&PTR_EncodedSize_00146838;
        t.parameters.encodedValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        t.parameters.super_DerBase.cbData = 0;
        t.parameters.encodedValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        if (uVar4 < sVar5) {
          this = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error(this,"Integer overflow");
          __cxa_throw(this,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        bVar3 = AlgorithmIdentifier::Decode
                          ((AlgorithmIdentifier *)local_e0,
                           t.parameters.encodedValue.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + sVar5,uVar4 - sVar5,
                           &local_50);
        sVar1 = local_50;
        if (bVar3) {
          std::vector<AlgorithmIdentifier,_std::allocator<AlgorithmIdentifier>_>::push_back
                    (out,(AlgorithmIdentifier *)local_e0);
          sVar5 = sVar5 + sVar1;
          bVar6 = sVar5 == *local_40 + *(long *)cbElement;
          bVar3 = !bVar6;
          bVar2 = (bool)(bVar6 | bVar2);
        }
        else {
          if (local_50 == 0) {
            *local_40 = 0;
            *(undefined8 *)cbElement = 0;
          }
          bVar2 = false;
          bVar3 = false;
        }
        AlgorithmIdentifier::~AlgorithmIdentifier((AlgorithmIdentifier *)local_e0);
      } while (bVar3);
      return bVar2;
    }
    sVar5 = 2;
  }
  else {
    sVar5 = 0;
  }
  *local_40 = sVar5;
  *(undefined8 *)cbElement = 0;
  return bVar2;
}

Assistant:

static bool DecodeSetOrSequenceOf(DerType type, const unsigned char* pIn, size_t cbIn, size_t& cbPrefix, size_t& cbSize, std::vector<T>& out)
	{
		bool isNull = false;
		size_t offset = 0;

		out.clear();

		if (!DecodeSequenceOrSet(type, pIn, cbIn, cbPrefix, cbSize, isNull))
		{
			cbPrefix = 0;
			cbSize = 0;
			return false;
		}

		if (isNull)
		{
			cbPrefix = 2;
			cbSize = 0;
			return true;
		}

		offset = cbPrefix;
        cbIn = cbPrefix + cbSize;

		for (;;)
		{
			size_t cbElement = 0;
			T t;

			if (offset > cbIn)
				throw std::overflow_error("Integer overflow");

			if (!t.Decode(pIn + offset, cbIn - offset, cbElement))
			{
				// Accomodate the case where we have to decode into the 
				// sequence to see if the element is optional
				if( cbElement == 0 )
				{
					cbPrefix = 0;
					cbSize = 0;
				}
				return false;
			}

			offset += cbElement;
			out.push_back(t);

			// Exit conditions - should have used all of our
			// incoming data, as long as everything is polite
			if (offset == cbSize + cbPrefix)
			{
				return true;
			}
		}
	}